

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void opj_thread_pool_destroy(opj_thread_pool_t *tp)

{
  opj_worker_thread_list_t *poVar1;
  opj_worker_thread_list_t *next;
  int i;
  opj_thread_pool_t *tp_local;
  
  if (tp != (opj_thread_pool_t *)0x0) {
    if (tp->cond != (opj_cond_t *)0x0) {
      opj_thread_pool_wait_completion(tp,0);
      opj_mutex_lock(tp->mutex);
      tp->state = OPJWTS_STOP;
      opj_mutex_unlock(tp->mutex);
      for (next._4_4_ = 0; next._4_4_ < tp->worker_threads_count; next._4_4_ = next._4_4_ + 1) {
        opj_mutex_lock(tp->worker_threads[next._4_4_].mutex);
        opj_cond_signal(tp->worker_threads[next._4_4_].cond);
        opj_mutex_unlock(tp->worker_threads[next._4_4_].mutex);
        opj_thread_join(tp->worker_threads[next._4_4_].thread);
        opj_cond_destroy(tp->worker_threads[next._4_4_].cond);
        opj_mutex_destroy(tp->worker_threads[next._4_4_].mutex);
      }
      opj_free(tp->worker_threads);
      while (tp->waiting_worker_thread_list != (opj_worker_thread_list_t *)0x0) {
        poVar1 = tp->waiting_worker_thread_list->next;
        opj_free(tp->waiting_worker_thread_list);
        tp->waiting_worker_thread_list = poVar1;
      }
      opj_cond_destroy(tp->cond);
    }
    opj_mutex_destroy(tp->mutex);
    opj_tls_destroy(tp->tls);
    opj_free(tp);
  }
  return;
}

Assistant:

void opj_thread_pool_destroy(opj_thread_pool_t* tp)
{
    if (!tp) {
        return;
    }
    if (tp->cond) {
        int i;
        opj_thread_pool_wait_completion(tp, 0);

        opj_mutex_lock(tp->mutex);
        tp->state = OPJWTS_STOP;
        opj_mutex_unlock(tp->mutex);

        for (i = 0; i < tp->worker_threads_count; i++) {
            opj_mutex_lock(tp->worker_threads[i].mutex);
            opj_cond_signal(tp->worker_threads[i].cond);
            opj_mutex_unlock(tp->worker_threads[i].mutex);
            opj_thread_join(tp->worker_threads[i].thread);
            opj_cond_destroy(tp->worker_threads[i].cond);
            opj_mutex_destroy(tp->worker_threads[i].mutex);
        }

        opj_free(tp->worker_threads);

        while (tp->waiting_worker_thread_list != NULL) {
            opj_worker_thread_list_t* next = tp->waiting_worker_thread_list->next;
            opj_free(tp->waiting_worker_thread_list);
            tp->waiting_worker_thread_list = next;
        }

        opj_cond_destroy(tp->cond);
    }
    opj_mutex_destroy(tp->mutex);
    opj_tls_destroy(tp->tls);
    opj_free(tp);
}